

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WienerFilter.cpp
# Opt level: O1

double WienerFilterImpl(Mat *src,Mat *dst,double noiseVariance,Size *block)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  __m128d t;
  Mat1d variances;
  Mat1d means;
  Mat1d means2;
  Mat1d avgVarianceMat;
  Mat1d sqrMeans;
  Mat m;
  undefined8 local_508;
  int local_500;
  int local_4fc;
  undefined8 local_4f8;
  int local_4f0;
  int local_4ec;
  undefined4 local_4e8;
  uint *local_4e0;
  undefined8 local_4d8;
  uint local_4d0 [4];
  long local_4c0;
  long *local_488;
  uint local_470 [4];
  long local_460;
  long *local_428;
  undefined1 local_410 [16];
  Size local_400;
  Mat local_3a0 [96];
  Mat local_340 [144];
  Mat_<double> local_2b0;
  uint local_250 [4];
  double *local_240;
  uint local_1f0 [24];
  undefined1 local_190 [16];
  Size SStack_180;
  Mat local_120 [96];
  Mat aMStack_c0 [144];
  
  if (((((block->width & 0x80000001U) == 1) && (1 < block->height)) && (1 < block->width)) &&
     ((block->height & 0x80000001U) == 1)) {
    if ((*(ushort *)dst & 0xff8) == 0) {
      uVar2 = *(uint *)(src + 8);
      uVar3 = *(uint *)(src + 0xc);
      cv::Mat::Mat((Mat *)local_410,uVar2,uVar3,0);
      cv::Mat::operator=(dst,(Mat *)local_410);
      cv::Mat::~Mat((Mat *)local_410);
      cv::Mat::Mat((Mat *)local_470);
      local_470[0] = local_470[0] & 0xfffff000 | 6;
      cv::Mat::Mat((Mat *)local_1f0);
      local_1f0[0] = local_1f0[0] & 0xfffff000 | 6;
      cv::Mat::Mat((Mat *)local_4d0);
      local_4d0[0] = local_4d0[0] & 0xfffff000 | 6;
      cv::Mat::Mat((Mat *)local_250);
      local_250[0] = local_250[0] & 0xfffff000 | 6;
      local_400.width = 0;
      local_400.height = 0;
      local_410._0_4_ = 0x1010000;
      SStack_180.width = 0;
      SStack_180.height = 0;
      local_190._0_4_ = -0x7dfefffa;
      local_4f0 = block->width;
      local_4ec = block->height;
      local_4f8 = 0xffffffffffffffff;
      local_410._8_8_ = src;
      local_190._8_8_ = local_470;
      cv::boxFilter(local_410,local_190,6,&local_4f0,&local_4f8,1,1);
      local_400.width = 0;
      local_400.height = 0;
      local_410._0_4_ = 0x1010000;
      SStack_180.width = 0;
      SStack_180.height = 0;
      local_190._0_4_ = -0x7dfefffa;
      local_190._8_8_ = local_1f0;
      local_500 = block->width;
      local_4fc = block->height;
      local_508 = 0xffffffffffffffff;
      local_410._8_8_ = src;
      cv::sqrBoxFilter(local_410,local_190,6,&local_500,&local_508,1,1);
      local_4d8 = 0;
      local_4e8 = 0x81010006;
      local_4e0 = local_470;
      cv::Mat::mul((_InputArray *)local_410,1.0);
      cv::Mat::Mat(&local_2b0.super_Mat);
      local_2b0._0_4_ = local_2b0._0_4_ & 0xfffff000 | 6;
      cv::Mat::Mat((Mat *)local_190);
      (**(code **)(*(long *)CONCAT44(local_410._4_4_,local_410._0_4_) + 0x18))
                ((long *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410,(Mat *)local_190,
                 0xffffffff);
      cv::Mat_<double>::operator=(&local_2b0,(Mat *)local_190);
      cv::Mat::~Mat((Mat *)local_190);
      cv::Mat::~Mat(local_340);
      cv::Mat::~Mat(local_3a0);
      cv::Mat::~Mat((Mat *)(local_410 + 0x10));
      local_4d8 = 0;
      local_4e8 = 0x81010006;
      local_4e0 = local_470;
      cv::Mat::mul((_InputArray *)local_190,1.0);
      cv::operator-((Mat *)local_410,(MatExpr *)local_1f0);
      (**(code **)(*(long *)CONCAT44(local_410._4_4_,local_410._0_4_) + 0x18))
                ((long *)CONCAT44(local_410._4_4_,local_410._0_4_),local_410,local_4d0);
      cv::Mat::~Mat(local_340);
      cv::Mat::~Mat(local_3a0);
      cv::Mat::~Mat((Mat *)(local_410 + 0x10));
      cv::Mat::~Mat(aMStack_c0);
      cv::Mat::~Mat(local_120);
      cv::Mat::~Mat((Mat *)(local_190 + 0x10));
      if (noiseVariance < 0.0) {
        local_400.width = 0;
        local_400.height = 0;
        local_410._0_4_ = -0x7efefffa;
        local_410._8_8_ = local_4d0;
        SStack_180.width = 0;
        SStack_180.height = 0;
        local_190._0_4_ = -0x7dfefffa;
        local_190._8_8_ = (Mat *)local_250;
        cv::reduce((_InputArray *)local_410,(_OutputArray *)local_190,1,0,-1);
        local_400.width = 0;
        local_400.height = 0;
        local_410._0_4_ = -0x7efefffa;
        SStack_180.width = 0;
        SStack_180.height = 0;
        local_190._0_4_ = -0x7dfefffa;
        local_410._8_8_ = (Mat *)local_250;
        local_190._8_8_ = (Mat *)local_250;
        cv::reduce((_InputArray *)local_410,(_OutputArray *)local_190,0,0,-1);
        noiseVariance = *local_240 / (double)(int)(uVar2 * uVar3);
      }
      if (0 < (int)uVar2) {
        uVar10 = 0;
        do {
          if (0 < (int)uVar3) {
            lVar4 = **(long **)(dst + 0x48);
            lVar5 = *(long *)(dst + 0x10);
            lVar6 = **(long **)(src + 0x48);
            lVar7 = *(long *)(src + 0x10);
            lVar8 = *local_488;
            lVar9 = *local_428;
            uVar11 = 0;
            do {
              dVar1 = *(double *)(lVar9 * uVar10 + local_460 + uVar11 * 8);
              dVar13 = *(double *)(lVar8 * uVar10 + local_4c0 + uVar11 * 8);
              dVar14 = noiseVariance;
              if (noiseVariance <= dVar13) {
                dVar14 = dVar13;
              }
              dVar13 = dVar13 - noiseVariance;
              if (dVar13 <= 0.0) {
                dVar13 = 0.0;
              }
              iVar12 = (int)ROUND(((double)*(byte *)(lVar6 * uVar10 + lVar7 + uVar11) - dVar1) *
                                  (dVar13 / dVar14) + dVar1);
              if (iVar12 < 1) {
                iVar12 = 0;
              }
              if (0xfe < iVar12) {
                iVar12 = 0xff;
              }
              *(char *)(lVar4 * uVar10 + lVar5 + uVar11) = (char)iVar12;
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar2);
      }
      cv::Mat::~Mat(&local_2b0.super_Mat);
      cv::Mat::~Mat((Mat *)local_250);
      cv::Mat::~Mat((Mat *)local_4d0);
      cv::Mat::~Mat((Mat *)local_1f0);
      cv::Mat::~Mat((Mat *)local_470);
      return noiseVariance;
    }
    __assert_fail("(\"src and dst must be one channel grayscale images\", src.channels() == 1, dst.channels() == 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/prittt[P]AdaptiveWienerFilter/WienerFilter.cpp"
                  ,0x28,"double WienerFilterImpl(const Mat &, Mat &, double, const Size &)");
  }
  __assert_fail("(\"Invalid block dimensions\", block.width % 2 == 1 && block.height % 2 == 1 && block.width > 1 && block.height > 1)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/prittt[P]AdaptiveWienerFilter/WienerFilter.cpp"
                ,0x27,"double WienerFilterImpl(const Mat &, Mat &, double, const Size &)");
}

Assistant:

double WienerFilterImpl(const Mat& src, Mat& dst, double noiseVariance, const Size& block) {
	assert(("Invalid block dimensions", block.width % 2 == 1 && block.height % 2 == 1 && block.width > 1 && block.height > 1));
	assert(("src and dst must be one channel grayscale images", src.channels() == 1, dst.channels() == 1));

	int h = src.rows;
	int w = src.cols;

	dst = Mat1b(h, w);

	Mat1d means, sqrMeans, variances;
	Mat1d avgVarianceMat;

	boxFilter(src, means, CV_64F, block, Point(-1, -1), true, BORDER_REPLICATE);
	sqrBoxFilter(src, sqrMeans, CV_64F, block, Point(-1, -1), true, BORDER_REPLICATE);

	Mat1d means2 = means.mul(means);
	variances = sqrMeans - (means.mul(means));

	if (noiseVariance < 0) {
		// I have to estimate the noiseVariance
		reduce(variances, avgVarianceMat, 1, REDUCE_SUM, -1);
		reduce(avgVarianceMat, avgVarianceMat, 0, REDUCE_SUM, -1);
		noiseVariance = avgVarianceMat(0, 0) / (h * w);
	}

	for (int r = 0; r < h; ++r) {
		// get row pointers
		uchar const* const srcRow = src.ptr<uchar>(r);
		uchar* const dstRow = dst.ptr<uchar>(r);
		double* const varRow = variances.ptr<double>(r);
		double* const meanRow = means.ptr<double>(r);
		for (int c = 0; c < w; ++c) {
			dstRow[c] = saturate_cast<uchar>(
				meanRow[c] + max(0., varRow[c] - noiseVariance) / max(varRow[c], noiseVariance) * (srcRow[c] - meanRow[c])
			);
		}
	}

	return noiseVariance;
}